

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<std::complex<long_double>_>::AddKel
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *elmat
          ,TPZVec<long> *source,TPZVec<long> *destinationindex)

{
  longdouble __r;
  int iVar1;
  long *plVar2;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  complex<long_double> prevval;
  int64_t jeqs;
  int64_t ieqs;
  int64_t jeq;
  int64_t ieq;
  int64_t jcoef;
  int64_t icoef;
  int64_t nelem;
  complex<long_double> *__z;
  undefined2 uVar3;
  undefined6 in_stack_ffffffffffffff22;
  undefined2 uVar4;
  undefined6 in_stack_ffffffffffffff32;
  int64_t in_stack_ffffffffffffff38;
  undefined8 local_b8 [4];
  undefined8 local_98 [4];
  complex<long_double> local_78;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  int64_t local_28;
  TPZVec<long> *local_20;
  TPZVec<long> *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_28 = TPZVec<long>::NElements(in_RDX);
  __r = (longdouble)0;
  __z = SUB108(__r,0);
  uVar3 = (undefined2)((unkuint10)__r >> 0x40);
  uVar4 = uVar3;
  std::complex<long_double>::complex(&local_78,__r,__r);
  iVar1 = (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
            super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar1 == 0) {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](local_20,local_30);
      local_40 = *plVar2;
      plVar2 = TPZVec<long>::operator[](local_18,local_30);
      local_50 = *plVar2;
      for (local_38 = 0; local_38 < local_28; local_38 = local_38 + 1) {
        plVar2 = TPZVec<long>::operator[](local_20,local_38);
        local_48 = *plVar2;
        plVar2 = TPZVec<long>::operator[](local_18,local_38);
        local_58 = *plVar2;
        (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
          ._vptr_TPZSavable[0x24])(local_b8,in_RDI,local_40,local_48);
        local_78._M_value._0_8_ = local_b8[0];
        local_78._M_value._8_8_ = local_b8[1];
        local_78._M_value._16_8_ = local_b8[2];
        local_78._M_value._24_8_ = local_b8[3];
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_RDI,in_stack_ffffffffffffff38,CONCAT62(in_stack_ffffffffffffff32,uVar4));
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_ffffffffffffff22,uVar3),__z);
        (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
          ._vptr_TPZSavable[0x23])(in_RDI,local_40,local_48,&local_78);
      }
    }
  }
  else {
    for (local_30 = 0; local_30 < local_28; local_30 = local_30 + 1) {
      plVar2 = TPZVec<long>::operator[](local_20,local_30);
      local_40 = *plVar2;
      plVar2 = TPZVec<long>::operator[](local_18,local_30);
      local_50 = *plVar2;
      for (local_38 = local_30; local_38 < local_28; local_38 = local_38 + 1) {
        plVar2 = TPZVec<long>::operator[](local_20,local_38);
        local_48 = *plVar2;
        plVar2 = TPZVec<long>::operator[](local_18,local_38);
        local_58 = *plVar2;
        (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
          ._vptr_TPZSavable[0x24])(local_98,in_RDI,local_40,local_48);
        local_78._M_value._0_8_ = local_98[0];
        local_78._M_value._8_8_ = local_98[1];
        local_78._M_value._16_8_ = local_98[2];
        local_78._M_value._24_8_ = local_98[3];
        TPZFMatrix<std::complex<long_double>_>::operator()
                  (in_RDI,in_stack_ffffffffffffff38,CONCAT62(in_stack_ffffffffffffff32,uVar4));
        std::complex<long_double>::operator+=
                  ((complex<long_double> *)CONCAT62(in_stack_ffffffffffffff22,uVar3),__z);
        (*(in_RDI->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable
          ._vptr_TPZSavable[0x23])(in_RDI,local_40,local_48,&local_78);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &source, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = source.NElements();
  	int64_t icoef,jcoef,ieq,jeq,ieqs,jeqs;
    TVar prevval;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			ieqs = source[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				jeqs = source[jcoef];
				prevval = GetVal(ieq,jeq);
				prevval += elmat(ieqs,jeqs);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}